

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
graphics101::HalfEdgeTriMesh::boundary_vertices
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,HalfEdgeTriMesh *this)

{
  pointer pHVar1;
  HalfEdge *__v;
  vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
  *__range1;
  HalfEdge *he;
  pointer __v_00;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> result;
  allocator_type local_61;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_60;
  
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  pHVar1 = (this->m_halfedges).
           super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__v_00 = (this->m_halfedges).
                super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                ._M_impl.super__Vector_impl_data._M_start; __v_00 != pHVar1; __v_00 = __v_00 + 1) {
    if (__v_00->face == -1) {
      std::__detail::
      _Insert_base<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&local_60,&__v_00->to_vertex);
      __v = halfedge(this,&__v_00->opposite_he);
      std::__detail::
      _Insert_base<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&local_60,&__v->to_vertex);
    }
  }
  std::vector<long,std::allocator<long>>::
  vector<std::__detail::_Node_iterator<long,true,false>,void>
            ((vector<long,std::allocator<long>> *)__return_storage_ptr__,
             (_Node_iterator<long,_true,_false>)local_60._M_before_begin._M_nxt,
             (_Node_iterator<long,_true,_false>)0x0,&local_61);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector< HalfEdgeTriMesh::Index > HalfEdgeTriMesh::boundary_vertices() const
{
    // Use an std::set<> if we wanted the returned sequence to be sorted.
    std::unordered_set< Index > result;
    for( const HalfEdge& he : m_halfedges )
    {
        if( -1 == he.face )
        {
            // result.extend( self.he_index2directed_edge( hei ) )
            result.insert( he.to_vertex );
            result.insert( halfedge( he.opposite_he ).to_vertex );
        }
    }

    return Indices( result.begin(), result.end() );
}